

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O3

size_t ZSTD_ldm_generateSequences
                 (ldmState_t *ldmState,rawSeqStore_t *sequences,ldmParams_t *params,void *src,
                 size_t srcSize)

{
  BYTE **ppBVar1;
  U32 *pUVar2;
  ulong *puVar3;
  ulong *puVar4;
  ldmEntry_t *plVar5;
  ulong *puVar6;
  size_t sVar7;
  rawSeq *prVar8;
  bool bVar9;
  byte bVar10;
  uint uVar11;
  size_t sVar12;
  XXH64_hash_t XVar13;
  byte bVar14;
  byte bVar15;
  uint uVar16;
  U32 UVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong *puVar21;
  ldmEntry_t *plVar22;
  BYTE *pBVar23;
  ulong *puVar24;
  ulong *puVar25;
  long lVar26;
  BYTE *data;
  U32 UVar27;
  ulong uVar28;
  ulong uVar29;
  BYTE *pBVar30;
  uint uVar31;
  uint uVar32;
  BYTE *pBVar33;
  ulong *puVar34;
  ulong *puVar35;
  ldmEntry_t **pplVar36;
  ulong *puVar37;
  ulong uVar38;
  long lVar39;
  ulong *puVar40;
  ldmRollingHashState_t hashState;
  ulong local_1a0;
  uint local_184;
  ulong local_180;
  ulong *local_178;
  ulong local_170;
  size_t local_168;
  ulong *local_160;
  ldmEntry_t *local_158;
  ulong local_150;
  uint local_148;
  uint local_144;
  void *local_140;
  long local_138;
  ulong local_130;
  ulong local_128;
  long local_120;
  BYTE *local_118;
  ulong *local_110;
  rawSeqStore_t *local_108;
  ldmMatchCandidate_t *local_100;
  ulong *local_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  ulong local_d8;
  BYTE *local_d0;
  ulong local_c8;
  size_t local_c0;
  long local_b8;
  ldmEntry_t **local_b0;
  ulong *local_a8;
  BYTE *local_a0;
  size_t *local_98;
  ulong *local_90;
  ulong *local_88;
  BYTE *local_80;
  BYTE *local_78;
  long local_70;
  ulong local_68;
  ulong local_60;
  ulong *local_58;
  BYTE *local_50;
  ulong *local_48;
  ldmRollingHashState_t local_40;
  
  uVar31 = 1 << ((byte)params->windowLog & 0x1f);
  local_170 = (ulong)uVar31;
  local_a8 = (ulong *)((long)src + srcSize);
  local_138 = ((srcSize >> 0x14) + 1) - (ulong)((srcSize & 0xfffff) == 0);
  if ((ldmState->window).nextSrc < local_a8) {
    __assert_fail("ldmState->window.nextSrc >= (BYTE const*)src + srcSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_ldm.c"
                  ,0x209,
                  "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                 );
  }
  uVar20 = sequences->size;
  if (uVar20 < sequences->pos) {
    __assert_fail("sequences->pos <= sequences->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_ldm.c"
                  ,0x20d,
                  "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                 );
  }
  if (sequences->capacity < uVar20) {
    __assert_fail("sequences->size <= sequences->capacity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_ldm.c"
                  ,0x20e,
                  "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                 );
  }
  if (local_138 != 0) {
    uVar31 = uVar31 + 2;
    local_98 = ldmState->splitIndices;
    local_100 = ldmState->matchCandidates;
    local_b0 = &ldmState->matchCandidates[0].bucket;
    local_120 = 0;
    local_128 = 0;
    local_140 = src;
    local_c0 = srcSize;
    do {
      if (sequences->capacity <= uVar20) {
        return 0;
      }
      puVar34 = (ulong *)((long)local_140 + local_120 * 0x100000);
      puVar24 = puVar34 + 0x20000;
      if (srcSize + local_120 * -0x100000 < 0x100000) {
        puVar24 = local_a8;
      }
      if ((long)srcSize <= local_120 * 0x100000) {
        __assert_fail("chunkStart < iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_ldm.c"
                      ,0x218,
                      "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                     );
      }
      pBVar23 = (ldmState->window).base;
      uVar11 = (int)puVar24 - (int)pBVar23;
      if (uVar11 < 0xe0000001) {
        UVar17 = ldmState->loadedDictEnd;
      }
      else {
        UVar17 = params->hashLog;
        uVar11 = (int)puVar34 - (int)pBVar23;
        uVar16 = uVar11 - uVar31;
        if (uVar11 < uVar31 || uVar16 == 0) {
          __assert_fail("curr > newCurrent",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x448,
                        "U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)");
        }
        if (uVar16 < 0x10000001) {
          __assert_fail("correction > 1<<28",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,1099,
                        "U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)");
        }
        pBVar23 = pBVar23 + uVar16;
        (ldmState->window).base = pBVar23;
        ppBVar1 = &(ldmState->window).dictBase;
        *ppBVar1 = *ppBVar1 + uVar16;
        uVar11 = (ldmState->window).dictLimit;
        uVar18 = (ldmState->window).lowLimit;
        uVar32 = uVar18 - uVar16;
        if (uVar18 < uVar16 + 2) {
          uVar32 = 2;
        }
        (ldmState->window).lowLimit = uVar32;
        uVar18 = uVar11 - uVar16;
        if (uVar11 < uVar16 + 2) {
          uVar18 = 2;
        }
        (ldmState->window).dictLimit = uVar18;
        if (uVar31 < uVar32) {
          __assert_fail("window->lowLimit <= newCurrent",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x45f,
                        "U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)");
        }
        if (uVar31 < uVar18) {
          __assert_fail("window->dictLimit <= newCurrent",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x460,
                        "U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)");
        }
        pUVar2 = &(ldmState->window).nbOverflowCorrections;
        *pUVar2 = *pUVar2 + 1;
        plVar5 = ldmState->hashTable;
        lVar39 = 0;
        do {
          uVar11 = plVar5[lVar39].offset;
          UVar27 = uVar11 - uVar16;
          if (uVar11 < uVar16) {
            UVar27 = 0;
          }
          plVar5[lVar39].offset = UVar27;
          lVar39 = lVar39 + 1;
        } while (1L << ((byte)UVar17 & 0x3f) != lVar39);
        ldmState->loadedDictEnd = 0;
        uVar11 = (int)puVar24 - (int)pBVar23;
        UVar17 = 0;
      }
      local_144 = (ldmState->window).lowLimit;
      if (UVar17 + (int)local_170 < uVar11) {
        uVar11 = uVar11 - (int)local_170;
        if (local_144 < uVar11) {
          (ldmState->window).lowLimit = uVar11;
          local_144 = uVar11;
        }
        UVar17 = (ldmState->window).dictLimit;
        if (UVar17 < local_144) {
          (ldmState->window).dictLimit = local_144;
          UVar17 = local_144;
        }
        ldmState->loadedDictEnd = 0;
      }
      else {
        UVar17 = (ldmState->window).dictLimit;
      }
      bVar14 = (byte)params->bucketSizeLog;
      local_70 = 1L << (bVar14 & 0x3f);
      uVar11 = params->minMatchLength;
      if (local_144 < UVar17) {
        pBVar33 = (ldmState->window).dictBase;
        uVar16 = local_144;
      }
      else {
        pBVar33 = (BYTE *)0x0;
        uVar16 = UVar17;
      }
      uVar19 = (long)puVar24 - (long)puVar34;
      local_48 = (ulong *)(pBVar33 + UVar17);
      local_178 = (ulong *)(pBVar33 + uVar16);
      if (UVar17 <= local_144) {
        local_178 = (ulong *)0x0;
      }
      local_110 = (ulong *)0x0;
      if (UVar17 > local_144) {
        local_110 = local_48;
      }
      uVar28 = (ulong)uVar11;
      uVar29 = uVar19;
      local_130 = uVar20;
      if (uVar28 <= uVar19) {
        pBVar30 = (BYTE *)((long)puVar34 + (uVar19 - 8));
        if (0x3f < uVar11) {
          uVar11 = 0x40;
        }
        bVar15 = (byte)params->hashRateLog;
        local_40.rolling = 0xffffffff;
        bVar10 = (char)uVar11 - bVar15;
        if (uVar11 <= params->hashRateLog - 1) {
          bVar10 = 0;
        }
        local_40.stopMask = ~(-1L << (bVar15 & 0x3f)) << (bVar10 & 0x3f);
        data = (BYTE *)(uVar28 + (long)puVar34);
        local_180 = uVar28;
        local_50 = pBVar33;
        if (data < pBVar30) {
          puVar4 = (ulong *)(pBVar23 + UVar17);
          local_58 = (ulong *)(uVar19 + (long)puVar34);
          local_b8 = -uVar28;
          local_148 = ~(-1 << ((char)params->hashLog - bVar14 & 0x1f));
          puVar3 = (ulong *)((long)local_58 - 7);
          local_f0 = (ulong *)((long)local_58 + -3);
          local_f8 = (ulong *)((long)local_58 + -1);
          local_78 = pBVar23 + 8;
          local_80 = pBVar23 + -1;
          local_d0 = pBVar23 + (ulong)UVar17 + 8;
          local_90 = (ulong *)((long)local_110 + -1);
          local_108 = sequences;
          local_c8 = uVar19;
          local_a0 = pBVar30;
          do {
            local_184 = 0;
            sVar12 = ZSTD_ldm_gear_feed(&local_40,data,(long)local_a0 - (long)data,local_98,
                                        &local_184);
            lVar39 = local_b8;
            uVar20 = local_180;
            if ((ulong)local_184 != 0) {
              uVar19 = 0;
              pplVar36 = local_b0;
              local_168 = sVar12;
              local_150 = (ulong)local_184;
              local_118 = data;
              do {
                sVar12 = ldmState->splitIndices[uVar19];
                XVar13 = ZSTD_XXH64(data + sVar12 + lVar39,uVar20,0);
                uVar11 = (uint)XVar13 & local_148;
                ((ldmMatchCandidate_t *)(pplVar36 + -2))->split = data + sVar12 + lVar39;
                *(uint *)(pplVar36 + -1) = uVar11;
                *(U32 *)((long)pplVar36 + -4) = (U32)(XVar13 >> 0x20);
                *pplVar36 = ldmState->hashTable +
                            ((ulong)uVar11 << ((byte)params->bucketSizeLog & 0x3f));
                uVar19 = uVar19 + 1;
                pplVar36 = pplVar36 + 3;
              } while (local_150 != uVar19);
              local_88 = (ulong *)(local_118 + local_168);
              uVar20 = 0;
              do {
                local_60 = uVar20;
                puVar6 = (ulong *)local_100[local_60].split;
                uVar11 = local_100[local_60].checksum;
                local_d8 = (ulong)local_100[local_60].hash;
                uVar20 = (long)puVar6 - (long)pBVar23;
                sVar12 = local_168;
                sequences = local_108;
                if (puVar6 < puVar34) {
LAB_006d5ecc:
                  bVar14 = (byte)params->bucketSizeLog;
                  pBVar33 = ldmState->bucketOffsets;
                  bVar10 = pBVar33[local_d8];
                  ldmState->hashTable[(local_d8 << (bVar14 & 0x3f)) + (ulong)bVar10] =
                       (ldmEntry_t)(uVar20 & 0xffffffff | (ulong)uVar11 << 0x20);
                  pBVar33[local_d8] = ~(byte)(-1 << (bVar14 & 0x1f)) & bVar10 + 1;
                }
                else {
                  plVar22 = local_100[local_60].bucket;
                  plVar5 = plVar22 + local_70;
                  local_160 = (ulong *)((long)puVar6 + -1);
                  local_e0 = 0;
                  local_e8 = 0;
                  local_1a0 = 0;
                  local_158 = (ldmEntry_t *)0x0;
                  do {
                    if (plVar22->checksum == uVar11) {
                      uVar18 = plVar22->offset;
                      uVar19 = (ulong)uVar18;
                      if (uVar16 < uVar18) {
                        if (local_144 < UVar17) {
                          puVar21 = local_58;
                          pBVar33 = pBVar23;
                          if (uVar18 < UVar17) {
                            puVar21 = local_48;
                            pBVar33 = local_50;
                          }
                          puVar35 = (ulong *)(pBVar33 + uVar19);
                          puVar37 = (ulong *)(((long)puVar21 - (long)puVar35) + (long)puVar6);
                          if (puVar24 <= puVar37) {
                            puVar37 = local_58;
                          }
                          puVar25 = puVar6;
                          puVar40 = puVar35;
                          if (puVar6 < (ulong *)((long)puVar37 - 7U)) {
                            if (*puVar35 == *puVar6) {
                              lVar39 = 0;
                              do {
                                puVar25 = (ulong *)((long)puVar6 + lVar39 + 8);
                                if ((ulong *)((long)puVar37 - 7U) <= puVar25) {
                                  puVar40 = (ulong *)(pBVar33 + lVar39 + uVar19 + 8);
                                  goto LAB_006d5aa4;
                                }
                                lVar26 = lVar39 + uVar19 + 8;
                                lVar39 = lVar39 + 8;
                              } while (*(ulong *)(pBVar33 + lVar26) == *puVar25);
                              uVar28 = *puVar25 ^ *(ulong *)(pBVar33 + lVar26);
                              uVar29 = 0;
                              if (uVar28 != 0) {
                                for (; (uVar28 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                                }
                              }
                              uVar29 = (uVar29 >> 3 & 0x1fffffff) + lVar39;
                            }
                            else {
                              uVar28 = *puVar6 ^ *puVar35;
                              uVar29 = 0;
                              if (uVar28 != 0) {
                                for (; (uVar28 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                                }
                              }
                              uVar29 = uVar29 >> 3 & 0x1fffffff;
                            }
                          }
                          else {
LAB_006d5aa4:
                            if ((puVar25 < (ulong *)((long)puVar37 - 3U)) &&
                               ((int)*puVar40 == (int)*puVar25)) {
                              puVar25 = (ulong *)((long)puVar25 + 4);
                              puVar40 = (ulong *)((long)puVar40 + 4);
                            }
                            if ((puVar25 < (ulong *)((long)puVar37 - 1U)) &&
                               ((short)*puVar40 == (short)*puVar25)) {
                              puVar25 = (ulong *)((long)puVar25 + 2);
                              puVar40 = (ulong *)((long)puVar40 + 2);
                            }
                            if (puVar25 < puVar37) {
                              puVar25 = (ulong *)((long)puVar25 +
                                                 (ulong)((char)*puVar40 == (char)*puVar25));
                            }
                            uVar29 = (long)puVar25 - (long)puVar6;
                          }
                          if ((ulong *)((long)puVar35 + uVar29) == puVar21) {
                            puVar21 = (ulong *)((long)puVar6 + uVar29);
                            puVar37 = puVar21;
                            puVar25 = puVar4;
                            if (puVar21 < puVar3) {
                              if (*puVar4 == *puVar21) {
                                lVar39 = 0;
                                do {
                                  puVar37 = (ulong *)((long)puVar6 + lVar39 + uVar29 + 8);
                                  if (puVar3 <= puVar37) {
                                    puVar25 = (ulong *)(local_d0 + lVar39);
                                    goto LAB_006d5c42;
                                  }
                                  puVar25 = (ulong *)(local_d0 + lVar39);
                                  lVar39 = lVar39 + 8;
                                } while (*puVar25 == *puVar37);
                                uVar38 = *puVar37 ^ *puVar25;
                                uVar28 = 0;
                                if (uVar38 != 0) {
                                  for (; (uVar38 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                                  }
                                }
                                uVar28 = (uVar28 >> 3 & 0x1fffffff) + lVar39;
                              }
                              else {
                                uVar38 = *puVar21 ^ *puVar4;
                                uVar28 = 0;
                                if (uVar38 != 0) {
                                  for (; (uVar38 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                                  }
                                }
                                uVar28 = uVar28 >> 3 & 0x1fffffff;
                              }
                            }
                            else {
LAB_006d5c42:
                              if ((puVar37 < local_f0) && ((int)*puVar25 == (int)*puVar37)) {
                                puVar37 = (ulong *)((long)puVar37 + 4);
                                puVar25 = (ulong *)((long)puVar25 + 4);
                              }
                              if ((puVar37 < local_f8) && ((short)*puVar25 == (short)*puVar37)) {
                                puVar37 = (ulong *)((long)puVar37 + 2);
                                puVar25 = (ulong *)((long)puVar25 + 2);
                              }
                              if (puVar37 < puVar24) {
                                puVar37 = (ulong *)((long)puVar37 +
                                                   (ulong)((char)*puVar25 == (char)*puVar37));
                              }
                              uVar28 = (long)puVar37 - (long)puVar21;
                            }
                            uVar29 = uVar29 + uVar28;
                          }
                          if (local_180 <= uVar29) {
                            puVar21 = puVar4;
                            if (uVar18 < UVar17) {
                              puVar21 = local_178;
                            }
                            if (puVar34 < puVar6) {
                              lVar39 = 0;
                              if (puVar21 < puVar35) {
                                puVar37 = (ulong *)(pBVar33 + uVar19);
                                lVar39 = 0;
                                puVar25 = local_160;
                                do {
                                  puVar37 = (ulong *)((long)puVar37 + -1);
                                  if (((char)*puVar25 != *(char *)puVar37) ||
                                     (lVar39 = lVar39 + 1, puVar25 <= puVar34)) break;
                                  puVar25 = (ulong *)((long)puVar25 + -1);
                                } while (puVar21 < puVar37);
                              }
                            }
                            else {
                              lVar39 = 0;
                            }
                            if ((puVar21 != local_178) &&
                               ((ulong *)((long)puVar35 - lVar39) == puVar21)) {
                              if (local_178 < local_110) {
                                lVar26 = 0;
                                if (puVar34 < (ulong *)((long)puVar6 + -lVar39)) {
                                  puVar35 = (ulong *)(-lVar39 + (long)local_160);
                                  lVar26 = 0;
                                  puVar21 = local_90;
                                  do {
                                    if (((char)*puVar35 != (char)*puVar21) ||
                                       (lVar26 = lVar26 + 1, puVar35 <= puVar34)) break;
                                    puVar35 = (ulong *)((long)puVar35 + -1);
                                    bVar9 = local_178 < puVar21;
                                    puVar21 = (ulong *)((long)puVar21 + -1);
                                  } while (bVar9);
                                }
                              }
                              else {
                                lVar26 = 0;
                              }
                              lVar39 = lVar39 + lVar26;
                            }
LAB_006d5da1:
                            if (local_1a0 < uVar29 + lVar39) {
                              local_1a0 = uVar29 + lVar39;
                              local_158 = plVar22;
                              local_e8 = lVar39;
                              local_e0 = uVar29;
                            }
                          }
                        }
                        else {
                          puVar21 = (ulong *)(pBVar23 + uVar19);
                          puVar35 = puVar6;
                          if (puVar6 < puVar3) {
                            if (*puVar21 == *puVar6) {
                              lVar39 = 0;
                              do {
                                puVar35 = (ulong *)((long)puVar6 + lVar39 + 8);
                                if (puVar3 <= puVar35) {
                                  puVar21 = (ulong *)(local_78 + lVar39 + uVar19);
                                  goto LAB_006d5b7a;
                                }
                                lVar26 = lVar39 + uVar19;
                                lVar39 = lVar39 + 8;
                              } while (*(ulong *)(local_78 + lVar26) == *puVar35);
                              uVar28 = *puVar35 ^ *(ulong *)(local_78 + lVar26);
                              uVar29 = 0;
                              if (uVar28 != 0) {
                                for (; (uVar28 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                                }
                              }
                              uVar29 = (uVar29 >> 3 & 0x1fffffff) + lVar39;
                            }
                            else {
                              uVar28 = *puVar6 ^ *puVar21;
                              uVar29 = 0;
                              if (uVar28 != 0) {
                                for (; (uVar28 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                                }
                              }
                              uVar29 = uVar29 >> 3 & 0x1fffffff;
                            }
                          }
                          else {
LAB_006d5b7a:
                            if ((puVar35 < local_f0) && ((int)*puVar21 == (int)*puVar35)) {
                              puVar35 = (ulong *)((long)puVar35 + 4);
                              puVar21 = (ulong *)((long)puVar21 + 4);
                            }
                            if ((puVar35 < local_f8) && ((short)*puVar21 == (short)*puVar35)) {
                              puVar35 = (ulong *)((long)puVar35 + 2);
                              puVar21 = (ulong *)((long)puVar21 + 2);
                            }
                            if (puVar35 < puVar24) {
                              puVar35 = (ulong *)((long)puVar35 +
                                                 (ulong)((char)*puVar21 == (char)*puVar35));
                            }
                            uVar29 = (long)puVar35 - (long)puVar6;
                          }
                          if (local_180 <= uVar29) {
                            if ((puVar34 < puVar6) && (UVar17 < uVar18)) {
                              lVar39 = 0;
                              puVar21 = local_160;
                              puVar35 = (ulong *)(local_80 + uVar19);
                              do {
                                if (((char)*puVar21 != (char)*puVar35) ||
                                   (lVar39 = lVar39 + 1, puVar21 <= puVar34)) break;
                                puVar21 = (ulong *)((long)puVar21 + -1);
                                bVar9 = puVar4 < puVar35;
                                puVar35 = (ulong *)((long)puVar35 + -1);
                              } while (bVar9);
                            }
                            else {
                              lVar39 = 0;
                            }
                            goto LAB_006d5da1;
                          }
                        }
                      }
                    }
                    plVar22 = plVar22 + 1;
                  } while (plVar22 < plVar5);
                  local_68 = uVar20;
                  if (local_158 == (ldmEntry_t *)0x0) goto LAB_006d5ecc;
                  sVar7 = local_108->size;
                  if (sVar7 == local_108->capacity) {
                    return 0xffffffffffffffba;
                  }
                  prVar8 = local_108->seq;
                  UVar27 = local_158->offset;
                  prVar8[sVar7].litLength = ((int)puVar6 - (int)local_e8) - (int)puVar34;
                  prVar8[sVar7].matchLength = (int)local_e0 + (int)local_e8;
                  prVar8[sVar7].offset = (int)uVar20 - UVar27;
                  local_108->size = sVar7 + 1;
                  bVar14 = (byte)params->bucketSizeLog;
                  pBVar33 = ldmState->bucketOffsets;
                  bVar10 = pBVar33[local_d8];
                  ldmState->hashTable[(local_d8 << (bVar14 & 0x3f)) + (ulong)bVar10] =
                       (ldmEntry_t)(uVar20 & 0xffffffff | (ulong)uVar11 << 0x20);
                  pBVar33[local_d8] = ~(byte)(-1 << (bVar14 & 0x1f)) & bVar10 + 1;
                  puVar34 = (ulong *)((long)puVar6 + local_e0);
                  if (local_88 < puVar34) {
                    data = (BYTE *)((long)puVar34 - local_168);
                    break;
                  }
                }
                uVar20 = local_60 + 1;
                data = local_118;
              } while (local_60 + 1 != local_150);
            }
            data = data + sVar12;
          } while (data < local_a0);
          uVar19 = (long)puVar24 - (long)puVar34;
          uVar29 = local_c8;
        }
        if (0xffffffffffffff88 < uVar19) {
          return uVar19;
        }
        uVar20 = sequences->size;
        srcSize = local_c0;
      }
      if (local_130 < uVar20) {
        pUVar2 = &sequences->seq[local_130].litLength;
        *pUVar2 = *pUVar2 + (int)local_128;
      }
      else {
        if (uVar19 != uVar29) {
          __assert_fail("newLeftoverSize == chunkSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_ldm.c"
                        ,0x23f,
                        "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                       );
        }
        uVar19 = uVar29 + local_128;
      }
      local_120 = local_120 + 1;
      local_128 = uVar19;
    } while (local_120 != local_138);
  }
  return 0;
}

Assistant:

size_t ZSTD_ldm_generateSequences(
        ldmState_t* ldmState, rawSeqStore_t* sequences,
        ldmParams_t const* params, void const* src, size_t srcSize)
{
    U32 const maxDist = 1U << params->windowLog;
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    size_t const kMaxChunkSize = 1 << 20;
    size_t const nbChunks = (srcSize / kMaxChunkSize) + ((srcSize % kMaxChunkSize) != 0);
    size_t chunk;
    size_t leftoverSize = 0;

    assert(ZSTD_CHUNKSIZE_MAX >= kMaxChunkSize);
    /* Check that ZSTD_window_update() has been called for this chunk prior
     * to passing it to this function.
     */
    assert(ldmState->window.nextSrc >= (BYTE const*)src + srcSize);
    /* The input could be very large (in zstdmt), so it must be broken up into
     * chunks to enforce the maximum distance and handle overflow correction.
     */
    assert(sequences->pos <= sequences->size);
    assert(sequences->size <= sequences->capacity);
    for (chunk = 0; chunk < nbChunks && sequences->size < sequences->capacity; ++chunk) {
        BYTE const* const chunkStart = istart + chunk * kMaxChunkSize;
        size_t const remaining = (size_t)(iend - chunkStart);
        BYTE const *const chunkEnd =
            (remaining < kMaxChunkSize) ? iend : chunkStart + kMaxChunkSize;
        size_t const chunkSize = chunkEnd - chunkStart;
        size_t newLeftoverSize;
        size_t const prevSize = sequences->size;

        assert(chunkStart < iend);
        /* 1. Perform overflow correction if necessary. */
        if (ZSTD_window_needOverflowCorrection(ldmState->window, 0, maxDist, ldmState->loadedDictEnd, chunkStart, chunkEnd)) {
            U32 const ldmHSize = 1U << params->hashLog;
            U32 const correction = ZSTD_window_correctOverflow(
                &ldmState->window, /* cycleLog */ 0, maxDist, chunkStart);
            ZSTD_ldm_reduceTable(ldmState->hashTable, ldmHSize, correction);
            /* invalidate dictionaries on overflow correction */
            ldmState->loadedDictEnd = 0;
        }
        /* 2. We enforce the maximum offset allowed.
         *
         * kMaxChunkSize should be small enough that we don't lose too much of
         * the window through early invalidation.
         * TODO: * Test the chunk size.
         *       * Try invalidation after the sequence generation and test the
         *         offset against maxDist directly.
         *
         * NOTE: Because of dictionaries + sequence splitting we MUST make sure
         * that any offset used is valid at the END of the sequence, since it may
         * be split into two sequences. This condition holds when using
         * ZSTD_window_enforceMaxDist(), but if we move to checking offsets
         * against maxDist directly, we'll have to carefully handle that case.
         */
        ZSTD_window_enforceMaxDist(&ldmState->window, chunkEnd, maxDist, &ldmState->loadedDictEnd, NULL);
        /* 3. Generate the sequences for the chunk, and get newLeftoverSize. */
        newLeftoverSize = ZSTD_ldm_generateSequences_internal(
            ldmState, sequences, params, chunkStart, chunkSize);
        if (ZSTD_isError(newLeftoverSize))
            return newLeftoverSize;
        /* 4. We add the leftover literals from previous iterations to the first
         *    newly generated sequence, or add the `newLeftoverSize` if none are
         *    generated.
         */
        /* Prepend the leftover literals from the last call */
        if (prevSize < sequences->size) {
            sequences->seq[prevSize].litLength += (U32)leftoverSize;
            leftoverSize = newLeftoverSize;
        } else {
            assert(newLeftoverSize == chunkSize);
            leftoverSize += chunkSize;
        }
    }
    return 0;
}